

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavProcessItem(void)

{
  uint uVar1;
  ImGuiNavLayer IVar2;
  bool bVar3;
  float fVar4;
  ImRect IVar5;
  float VISIBLE_RATIO;
  ImGuiNavItemData *result;
  bool is_tabbing;
  bool is_tab_stop;
  bool candidate_for_nav_default_focus;
  ImGuiItemFlags item_flags;
  ImRect nav_bb;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffffa0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffa4;
  ImVec2 local_54;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImRect local_24;
  ImGuiID local_14;
  ImGuiWindow *local_10;
  ImGuiContext *result_00;
  
  result_00 = GImGui;
  local_10 = GImGui->CurrentWindow;
  local_14 = (GImGui->LastItemData).ID;
  local_24.Min = (GImGui->LastItemData).NavRect.Min;
  local_24.Max = (GImGui->LastItemData).NavRect.Max;
  uVar1 = (GImGui->LastItemData).InFlags;
  if (((GImGui->NavInitRequest & 1U) != 0) && (GImGui->NavLayer == (local_10->DC).NavLayerCurrent))
  {
    bVar3 = (uVar1 & 0x14) == 0;
    if ((bVar3) || (GImGui->NavInitResultId == 0)) {
      GImGui->NavInitResultId = local_14;
      IVar5 = WindowRectAbsToRel((ImGuiWindow *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88);
      local_3c = IVar5.Min;
      (result_00->NavInitResultRectRel).Min = local_3c;
      local_34 = IVar5.Max;
      (result_00->NavInitResultRectRel).Max = local_34;
    }
    if (bVar3) {
      result_00->NavInitRequest = false;
      NavUpdateAnyRequestFlag();
    }
  }
  if ((result_00->NavMoveScoringItems & 1U) != 0) {
    uVar6 = in_stack_ffffffffffffffa0 & 0xffffff;
    if ((uVar1 & 0x100) != 0) {
      uVar6 = CONCAT13((uVar1 & 5) == 0,(int3)in_stack_ffffffffffffffa0);
    }
    bVar3 = (result_00->NavMoveFlags & 0x400U) == 0;
    if (bVar3) {
      if ((((result_00->NavId != local_14) || ((result_00->NavMoveFlags & 0x10U) != 0)) &&
          ((uVar1 & 0xc) == 0)) && (bVar3)) {
        bVar3 = NavScoreItem((ImGuiNavItemData *)result_00);
        if (bVar3) {
          NavApplyItemToResult((ImGuiNavItemData *)CONCAT44(in_stack_ffffffffffffffa4,uVar6));
        }
        if (((result_00->NavMoveFlags & 0x20U) != 0) &&
           (bVar3 = ImRect::Overlaps(&local_10->ClipRect,&local_24), bVar3)) {
          in_stack_ffffffffffffff94 =
               ImClamp<float>(local_24.Max.y,(local_10->ClipRect).Min.y,(local_10->ClipRect).Max.y);
          fVar4 = ImClamp<float>(local_24.Min.y,(local_10->ClipRect).Min.y,
                                 (local_10->ClipRect).Max.y);
          if (((local_24.Max.y - local_24.Min.y) * 0.7 <= in_stack_ffffffffffffff94 - fVar4) &&
             (bVar3 = NavScoreItem((ImGuiNavItemData *)result_00), bVar3)) {
            NavApplyItemToResult((ImGuiNavItemData *)CONCAT44(in_stack_ffffffffffffffa4,uVar6));
          }
        }
      }
    }
    else if (((char)(uVar6 >> 0x18) != '\0') || ((result_00->NavMoveFlags & 0x200U) != 0)) {
      NavProcessItemForTabbingRequest((ImGuiID)in_stack_ffffffffffffff94);
    }
  }
  if (result_00->NavId == local_14) {
    result_00->NavWindow = local_10;
    result_00->NavLayer = (local_10->DC).NavLayerCurrent;
    result_00->NavFocusScopeId = (local_10->DC).NavFocusScopeIdCurrent;
    result_00->NavIdIsAlive = true;
    IVar5 = WindowRectAbsToRel((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
    local_54 = IVar5.Max;
    IVar2 = (local_10->DC).NavLayerCurrent;
    local_10->NavRectRel[IVar2].Min = IVar5.Min;
    (&local_10->NavRectRel[IVar2].Min)[1] = local_54;
  }
  return;
}

Assistant:

static void ImGui::NavProcessItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = g.LastItemData.ID;
    const ImRect nav_bb = g.LastItemData.NavRect;
    const ImGuiItemFlags item_flags = g.LastItemData.InFlags;

    // Process Init Request
    if (g.NavInitRequest && g.NavLayer == window->DC.NavLayerCurrent)
    {
        // Even if 'ImGuiItemFlags_NoNavDefaultFocus' is on (typically collapse/close button) we record the first ResultId so they can be used as a fallback
        const bool candidate_for_nav_default_focus = (item_flags & (ImGuiItemFlags_NoNavDefaultFocus | ImGuiItemFlags_Disabled)) == 0;
        if (candidate_for_nav_default_focus || g.NavInitResultId == 0)
        {
            g.NavInitResultId = id;
            g.NavInitResultRectRel = WindowRectAbsToRel(window, nav_bb);
        }
        if (candidate_for_nav_default_focus)
        {
            g.NavInitRequest = false; // Found a match, clear request
            NavUpdateAnyRequestFlag();
        }
    }

    // Process Move Request (scoring for navigation)
    // FIXME-NAV: Consider policy for double scoring (scoring from NavScoringRect + scoring from a rect wrapped according to current wrapping policy)
    if (g.NavMoveScoringItems)
    {
        const bool is_tab_stop = (item_flags & ImGuiItemFlags_Inputable) && (item_flags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
        const bool is_tabbing = (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) != 0;
        if (is_tabbing)
        {
            if (is_tab_stop || (g.NavMoveFlags & ImGuiNavMoveFlags_FocusApi))
                NavProcessItemForTabbingRequest(id);
        }
        else if ((g.NavId != id || (g.NavMoveFlags & ImGuiNavMoveFlags_AllowCurrentNavId)) && !(item_flags & (ImGuiItemFlags_Disabled | ImGuiItemFlags_NoNav)))
        {
            ImGuiNavItemData* result = (window == g.NavWindow) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;
            if (!is_tabbing)
            {
                if (NavScoreItem(result))
                    NavApplyItemToResult(result);

                // Features like PageUp/PageDown need to maintain a separate score for the visible set of items.
                const float VISIBLE_RATIO = 0.70f;
                if ((g.NavMoveFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet) && window->ClipRect.Overlaps(nav_bb))
                    if (ImClamp(nav_bb.Max.y, window->ClipRect.Min.y, window->ClipRect.Max.y) - ImClamp(nav_bb.Min.y, window->ClipRect.Min.y, window->ClipRect.Max.y) >= (nav_bb.Max.y - nav_bb.Min.y) * VISIBLE_RATIO)
                        if (NavScoreItem(&g.NavMoveResultLocalVisible))
                            NavApplyItemToResult(&g.NavMoveResultLocalVisible);
            }
        }
    }

    // Update window-relative bounding box of navigated item
    if (g.NavId == id)
    {
        g.NavWindow = window;                                           // Always refresh g.NavWindow, because some operations such as FocusItem() don't have a window.
        g.NavLayer = window->DC.NavLayerCurrent;
        g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
        g.NavIdIsAlive = true;
        window->NavRectRel[window->DC.NavLayerCurrent] = WindowRectAbsToRel(window, nav_bb);    // Store item bounding box (relative to window position)
    }
}